

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rasterizer-agg.cpp
# Opt level: O2

void __thiscall RasterizerAGG::RasterizerAGG(RasterizerAGG *this,Image *dst,uint32_t options)

{
  AGGRendererBase *this_00;
  AGGRasterizer *this_01;
  gamma_none local_21;
  
  Rasterizer::Rasterizer(&this->super_Rasterizer,dst,options);
  (this->super_Rasterizer)._vptr_Rasterizer = (_func_int **)&PTR__RasterizerAGG_0012dd78;
  agg::row_accessor<unsigned_char>::row_accessor
            (&this->_rbuf,dst->_data,dst->_width,dst->_height,(int)dst->_stride);
  (this->_pixfmt).m_rbuf = &this->_rbuf;
  this_00 = &this->_baseRenderer;
  agg::
  renderer_base<agg::pixfmt_alpha_blend_rgba<agg::blender_rgba_pre<agg::rgba8T<agg::linear>,_agg::order_bgra>,_agg::row_accessor<unsigned_char>_>_>
  ::renderer_base(this_00,&this->_pixfmt);
  (this->_solidRenderer).m_ren = this_00;
  this_01 = &this->_rasterizer;
  agg::rasterizer_scanline_aa<agg::rasterizer_sl_clip<agg::ras_conv_int>_>::rasterizer_scanline_aa
            (this_01);
  (this->_scanline).m_last_x = 0x7ffffff0;
  (this->_scanline).m_covers.m_array = (uchar *)0x0;
  (this->_scanline).m_covers.m_size = 0;
  (this->_scanline).m_cur_span = (span *)0x0;
  (this->_scanline).m_cover_ptr = (cover_type *)0x0;
  (this->_scanline).m_spans.m_array = (span *)0x0;
  (this->_scanline).m_spans.m_size = 0;
  builtin_strncpy((this->super_Rasterizer)._name,"AGG",4);
  Rasterizer::addOptionsToName(&this->super_Rasterizer);
  agg::rasterizer_scanline_aa<agg::rasterizer_sl_clip<agg::ras_conv_int>_>::gamma<agg::gamma_none>
            (this_01,&local_21);
  agg::rasterizer_scanline_aa<agg::rasterizer_sl_clip<agg::ras_conv_int>_>::clip_box
            (this_01,0.0,0.0,(double)dst->_width,(double)dst->_height);
  agg::
  renderer_base<agg::pixfmt_alpha_blend_rgba<agg::blender_rgba_pre<agg::rgba8T<agg::linear>,_agg::order_bgra>,_agg::row_accessor<unsigned_char>_>_>
  ::reset_clipping(this_00,true);
  return;
}

Assistant:

RasterizerAGG::RasterizerAGG(Image& dst, uint32_t options) noexcept
  : Rasterizer(dst, options),
    _rbuf(reinterpret_cast<unsigned char*>(dst.data()), dst.width(), dst.height(), int(dst.stride())),
    _pixfmt(_rbuf),
    _baseRenderer(_pixfmt),
    _solidRenderer(_baseRenderer) {
  std::snprintf(_name, ARRAY_SIZE(_name), "AGG");
  addOptionsToName();

  _rasterizer.gamma(agg::gamma_none());
  _rasterizer.clip_box(0, 0, dst.width(), dst.height());
  _baseRenderer.reset_clipping(true);
}